

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

String * __thiscall
glcts::ShaderStorageBufferLayoutBindingCase::getDefaultUniformName_abi_cxx11_
          (String *__return_storage_ptr__,ShaderStorageBufferLayoutBindingCase *this,int idx)

{
  ostream *this_00;
  StringStream s;
  StringStream local_190;
  
  StringStream::StringStream(&local_190);
  this_00 = std::operator<<((ostream *)&local_190,"buffer");
  std::ostream::operator<<(this_00,idx);
  std::__cxx11::stringbuf::str();
  StringStream::~StringStream(&local_190);
  return __return_storage_ptr__;
}

Assistant:

String getDefaultUniformName(int idx = 0)
	{
		StringStream s;

		s << "buffer" << idx;
		return s.str();
	}